

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::IGXMLScanner::commonInit(IGXMLScanner *this)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RefVectorOf<xercesc_4_0::KVStringPair> *this_00;
  undefined4 extraout_var_01;
  DTDValidator *this_01;
  SchemaValidator *this_02;
  IdentityConstraintHandler *this_03;
  ValueVectorOf<char16_t_*> *this_04;
  NameIdPool<xercesc_4_0::DTDElementDecl> *this_05;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_06;
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this_07;
  Hash2KeysSetOf<xercesc_4_0::StringHasher> *this_08;
  PSVIAttributeList *this_09;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *pRVar3;
  
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fElemStateSize << 2);
  this->fElemState = (uint *)CONCAT44(extraout_var,iVar2);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fElemStateSize << 2);
  this->fElemLoopState = (uint *)CONCAT44(extraout_var_00,iVar2);
  this_00 = (RefVectorOf<xercesc_4_0::KVStringPair> *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  RefVectorOf<xercesc_4_0::KVStringPair>::RefVectorOf
            (this_00,0x20,true,(this->super_XMLScanner).fMemoryManager);
  this->fRawAttrList = this_00;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar2 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)this->fRawAttrColonListSize << 2);
  this->fRawAttrColonList = (int *)CONCAT44(extraout_var_01,iVar2);
  this_01 = (DTDValidator *)XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  DTDValidator::DTDValidator(this_01,(XMLErrorReporter *)0x0);
  this->fDTDValidator = this_01;
  XMLScanner::initValidator(&this->super_XMLScanner,(XMLValidator *)this_01);
  this_02 = (SchemaValidator *)XMemory::operator_new(0xd0,(this->super_XMLScanner).fMemoryManager);
  SchemaValidator::SchemaValidator
            (this_02,(XMLErrorReporter *)0x0,(this->super_XMLScanner).fMemoryManager);
  this->fSchemaValidator = this_02;
  XMLScanner::initValidator(&this->super_XMLScanner,(XMLValidator *)this_02);
  this_03 = (IdentityConstraintHandler *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  IdentityConstraintHandler::IdentityConstraintHandler
            (this_03,&this->super_XMLScanner,(this->super_XMLScanner).fMemoryManager);
  this->fICHandler = this_03;
  this_04 = (ValueVectorOf<char16_t_*> *)
            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
  ValueVectorOf<char16_t_*>::ValueVectorOf(this_04,8,(this->super_XMLScanner).fMemoryManager,false);
  this->fLocationPairs = this_04;
  this_05 = (NameIdPool<xercesc_4_0::DTDElementDecl> *)
            XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
  NameIdPool<xercesc_4_0::DTDElementDecl>::NameIdPool
            (this_05,0x1d,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fDTDElemNonDeclPool = this_05;
  this_06 = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x40,(this->super_XMLScanner).fMemoryManager);
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::RefHash3KeysIdPool
            (this_06,0x1d,true,0x80,(this->super_XMLScanner).fMemoryManager);
  this->fSchemaElemNonDeclPool = this_06;
  this_07 = (RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *)
            XMemory::operator_new(0x38,(this->super_XMLScanner).fMemoryManager);
  RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::RefHashTableOf
            (this_07,0x83,false,(this->super_XMLScanner).fMemoryManager);
  this->fAttDefRegistry = this_07;
  this_08 = (Hash2KeysSetOf<xercesc_4_0::StringHasher> *)
            XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  Hash2KeysSetOf<xercesc_4_0::StringHasher>::Hash2KeysSetOf
            (this_08,7,(this->super_XMLScanner).fMemoryManager);
  this->fUndeclaredAttrRegistry = this_08;
  this_09 = (PSVIAttributeList *)XMemory::operator_new(0x18,(this->super_XMLScanner).fMemoryManager)
  ;
  PSVIAttributeList::PSVIAttributeList(this_09,(this->super_XMLScanner).fMemoryManager);
  this->fPSVIAttrList = this_09;
  pRVar3 = (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
            (pRVar3,0x1d,(this->super_XMLScanner).fMemoryManager);
  this->fSchemaInfoList = pRVar3;
  pRVar3 = (RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::RefHash2KeysTableOf
            (pRVar3,0x1d,(this->super_XMLScanner).fMemoryManager);
  this->fCachedSchemaInfoList = pRVar3;
  if ((this->super_XMLScanner).fValidator == (XMLValidator *)0x0) {
    (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
  }
  return;
}

Assistant:

void IGXMLScanner::commonInit()
{

    //  Create the element state array
    fElemState = (unsigned int*) fMemoryManager->allocate
    (
        fElemStateSize * sizeof(unsigned int)
    ); //new unsigned int[fElemStateSize];
    fElemLoopState = (unsigned int*) fMemoryManager->allocate
    (
        fElemStateSize * sizeof(unsigned int)
    ); //new unsigned int[fElemStateSize];

    //  And we need one for the raw attribute scan. This just stores key/
    //  value string pairs (prior to any processing.)
    fRawAttrList = new (fMemoryManager) RefVectorOf<KVStringPair>(32, true, fMemoryManager);
    fRawAttrColonList = (int*) fMemoryManager->allocate
    (
        fRawAttrColonListSize * sizeof(int)
    );

    //  Create the Validator and init them
    fDTDValidator = new (fMemoryManager) DTDValidator();
    initValidator(fDTDValidator);
    fSchemaValidator = new (fMemoryManager) SchemaValidator(0, fMemoryManager);
    initValidator(fSchemaValidator);

    // Create IdentityConstraint info
    fICHandler = new (fMemoryManager) IdentityConstraintHandler(this, fMemoryManager);

    // Create schemaLocation pair info
    fLocationPairs = new (fMemoryManager) ValueVectorOf<XMLCh*>(8, fMemoryManager);
    // create pools for undeclared elements
    fDTDElemNonDeclPool = new (fMemoryManager) NameIdPool<DTDElementDecl>(29, 128, fMemoryManager);
    fSchemaElemNonDeclPool = new (fMemoryManager) RefHash3KeysIdPool<SchemaElementDecl>(29, true, 128, fMemoryManager);
    fAttDefRegistry = new (fMemoryManager) RefHashTableOf<unsigned int, PtrHasher>
    (
        131, false, fMemoryManager
    );
    fUndeclaredAttrRegistry = new (fMemoryManager) Hash2KeysSetOf<StringHasher>(7, fMemoryManager);
    fPSVIAttrList = new (fMemoryManager) PSVIAttributeList(fMemoryManager);

    fSchemaInfoList = new (fMemoryManager) RefHash2KeysTableOf<SchemaInfo>(29, fMemoryManager);
    fCachedSchemaInfoList = new (fMemoryManager) RefHash2KeysTableOf<SchemaInfo>(29, fMemoryManager);

    // use fDTDValidator as the default validator
    if (!fValidator)
        fValidator = fDTDValidator;
}